

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageLoader.cpp
# Opt level: O3

bool __thiscall
sf::priv::ImageLoader::loadImageFromMemory
          (ImageLoader *this,void *data,size_t dataSize,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *pixels,Vector2u *size)

{
  pointer puVar1;
  char *__s;
  uchar *__src;
  ostream *poVar2;
  size_t sVar3;
  bool bVar4;
  long in_FS_OFFSET;
  int height;
  int width;
  int channels;
  uint local_10c;
  uint local_108 [2];
  stbi__context local_100;
  
  if (dataSize == 0 || data == (void *)0x0) {
    poVar2 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Failed to load image from memory, no data provided",0x32);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    bVar4 = false;
  }
  else {
    puVar1 = (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    local_108[0] = 0;
    local_10c = 0;
    local_108[1] = 0;
    local_100.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
    local_100.read_from_callbacks = 0;
    local_100.callback_already_read = 0;
    local_100.img_buffer_end = (stbi_uc *)((long)(int)dataSize + (long)data);
    local_100.img_buffer = (stbi_uc *)data;
    local_100.img_buffer_original = (stbi_uc *)data;
    local_100.img_buffer_original_end = local_100.img_buffer_end;
    __src = stbi__load_and_postprocess_8bit
                      (&local_100,(int *)local_108,(int *)&local_10c,(int *)(local_108 + 1),4);
    bVar4 = __src != (uchar *)0x0;
    if (__src == (uchar *)0x0) {
      poVar2 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"Failed to load image from memory. Reason: ",0x2a);
      __s = *(char **)(in_FS_OFFSET + -0x68);
      if (__s == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    else {
      size->x = local_108[0];
      size->y = local_10c;
      if (0 < (int)local_10c && 0 < (int)local_108[0]) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (pixels,(ulong)(local_108[0] * local_10c * 4));
        puVar1 = (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        memcpy(puVar1,__src,
               (long)(pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
      }
      free(__src);
    }
  }
  return bVar4;
}

Assistant:

bool ImageLoader::loadImageFromMemory(const void* data, std::size_t dataSize, std::vector<Uint8>& pixels, Vector2u& size)
{
    // Check input parameters
    if (data && dataSize)
    {
        // Clear the array (just in case)
        pixels.clear();

        // Load the image and get a pointer to the pixels in memory
        int width = 0;
        int height = 0;
        int channels = 0;
        const unsigned char* buffer = static_cast<const unsigned char*>(data);
        unsigned char* ptr = stbi_load_from_memory(buffer, static_cast<int>(dataSize), &width, &height, &channels, STBI_rgb_alpha);

        if (ptr)
        {
            // Assign the image properties
            size.x = static_cast<unsigned int>(width);
            size.y = static_cast<unsigned int>(height);

            if (width > 0 && height > 0)
            {
                // Copy the loaded pixels to the pixel buffer
                pixels.resize(static_cast<std::size_t>(width * height * 4));
                memcpy(&pixels[0], ptr, pixels.size());
            }

            // Free the loaded pixels (they are now in our own pixel buffer)
            stbi_image_free(ptr);

            return true;
        }
        else
        {
            // Error, failed to load the image
            err() << "Failed to load image from memory. Reason: " << stbi_failure_reason() << std::endl;

            return false;
        }
    }
    else
    {
        err() << "Failed to load image from memory, no data provided" << std::endl;
        return false;
    }
}